

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

int __thiscall
Centaurus::Grammar<wchar_t>::parse(Grammar<wchar_t> *this,char *filename,int machine_id)

{
  istream_type *__s;
  bool bVar1;
  wchar_t wVar2;
  StreamException *pSVar3;
  ulong uVar4;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
  __n;
  __enable_if_t<is_constructible<value_type,_pair<Identifier,_ATNMachine<wchar_t>_>_&&>::value,_pair<iterator,_bool>_>
  _Var5;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __beg;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __end;
  pair<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_> local_400;
  undefined1 local_3b0 [8];
  ATNMachine<wchar_t> atn;
  allocator local_361;
  string local_360;
  string local_340;
  Encoder local_320;
  Encoder enc;
  wstring wide_path;
  wchar_t ch_2;
  wchar_t ch_1;
  Identifier id;
  undefined1 local_2c0 [4];
  wchar_t ch;
  Stream stream;
  allocator<wchar_t> local_269;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_268;
  undefined1 local_258 [12];
  undefined1 local_248 [8];
  wstring grammar_str;
  wifstream grammar_file;
  int local_1c;
  int machine_id_local;
  char *filename_local;
  Grammar<wchar_t> *this_local;
  
  __s = (istream_type *)((long)&grammar_str.field_2 + 8);
  std::wifstream::wifstream(__s,filename,_S_in);
  std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator
            ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)local_258,__s);
  std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator(&local_268);
  std::allocator<wchar_t>::allocator();
  __end._M_c = local_268._M_c;
  __end._M_sbuf = local_268._M_sbuf;
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_258._0_8_;
  __beg._M_c = local_258._8_4_;
  __end._12_4_ = 0;
  std::__cxx11::wstring::wstring<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)local_248,__beg,__end,&local_269);
  std::allocator<wchar_t>::~allocator(&local_269);
  Stream::Stream((Stream *)local_2c0,(wstring *)local_248);
  __n._M_cur = (__node_type *)local_268._M_sbuf;
  local_1c = machine_id;
  do {
    id.m_id.field_2._M_local_buf[3] = Stream::skip_whitespace((Stream *)local_2c0);
    if (id.m_id.field_2._M_local_buf[3] == L'\0') {
      Stream::~Stream((Stream *)local_2c0);
      std::__cxx11::wstring::~wstring((wstring *)local_248);
      std::wifstream::~wifstream((void *)((long)&grammar_str.field_2 + 8));
      return local_1c;
    }
    if (0xffff < local_1c) {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::toomany(pSVar3,(Stream *)local_2c0,0xffff);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    Identifier::Identifier((Identifier *)&ch_2,(Stream *)local_2c0);
    bVar1 = Identifier::operator==((Identifier *)&ch_2,L"grammar");
    if (bVar1) {
      Stream::skip_whitespace((Stream *)local_2c0);
      Identifier::parse(&this->m_grammar_name,(Stream *)local_2c0);
      wVar2 = Stream::skip_whitespace((Stream *)local_2c0);
      if (wVar2 != L';') {
        pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar3,(Stream *)local_2c0,wVar2);
        __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
      }
      Stream::discard((Stream *)local_2c0);
    }
    else {
      bVar1 = Identifier::operator==((Identifier *)&ch_2,L"include");
      if (bVar1) {
        wVar2 = Stream::skip_whitespace((Stream *)local_2c0);
        if (wVar2 != L'\"') {
          pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar3,(Stream *)local_2c0,wVar2);
          __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::discard((Stream *)local_2c0);
        std::__cxx11::wstring::wstring((wstring *)&enc);
        wide_path.field_2._M_local_buf[2] = Stream::get((Stream *)local_2c0);
        while (wide_path.field_2._M_local_buf[2] != L'\"') {
          std::__cxx11::wstring::push_back((wchar_t)&enc);
          wide_path.field_2._M_local_buf[2] = Stream::get((Stream *)local_2c0);
        }
        wVar2 = Stream::skip_whitespace((Stream *)local_2c0);
        if (wVar2 != L';') {
          pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar3,(Stream *)local_2c0,wVar2);
          __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::discard((Stream *)local_2c0);
        Encoder::Encoder(&local_320);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_360,filename,&local_361);
        Encoder::wcstombs((Encoder *)&atn.m_globalid,(char *)&local_320,(wchar_t *)&enc,
                          (size_t)__n._M_cur);
        anon_unknown.dwarf_20a3c9::make_include_path
                  (&local_340,&local_360,(string *)&atn.m_globalid);
        local_1c = parse(this,&local_340,local_1c);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&atn.m_globalid);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        std::__cxx11::wstring::~wstring((wstring *)&enc);
      }
      else {
        ATNMachine<wchar_t>::ATNMachine
                  ((ATNMachine<wchar_t> *)local_3b0,local_1c,(Stream *)local_2c0);
        Identifier::str_abi_cxx11_(&this->m_root_id);
        uVar4 = std::__cxx11::wstring::empty();
        if ((uVar4 & 1) != 0) {
          Identifier::operator=(&this->m_root_id,(Identifier *)&ch_2);
        }
        std::pair<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>::
        pair<Centaurus::Identifier_&,_Centaurus::ATNMachine<wchar_t>,_true>
                  (&local_400,(Identifier *)&ch_2,(ATNMachine<wchar_t> *)local_3b0);
        _Var5 = std::
                unordered_map<Centaurus::Identifier,Centaurus::ATNMachine<wchar_t>,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>>>
                ::insert<std::pair<Centaurus::Identifier,Centaurus::ATNMachine<wchar_t>>>
                          ((unordered_map<Centaurus::Identifier,Centaurus::ATNMachine<wchar_t>,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>>>
                            *)&this->m_networks,&local_400);
        __n._M_cur = (__node_type *)
                     _Var5.first.
                     super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                     ._M_cur;
        std::pair<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>::~pair(&local_400);
        std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                  (&this->m_identifiers,(value_type *)&ch_2);
        ATNMachine<wchar_t>::~ATNMachine((ATNMachine<wchar_t> *)local_3b0);
        local_1c = local_1c + 1;
      }
    }
    Identifier::~Identifier((Identifier *)&ch_2);
  } while( true );
}

Assistant:

int Grammar<TCHAR>::parse(const char *filename, int machine_id)
{
    std::wifstream grammar_file(filename, std::ios::in);

    std::wstring grammar_str(std::istreambuf_iterator<wchar_t>(grammar_file), {});

    Stream stream(std::move(grammar_str));

    while (1)
    {
        wchar_t ch = stream.skip_whitespace();

        if (ch == L'\0')
            break;

        if (machine_id >= 65536)
            throw stream.toomany(65535);

        Identifier id(stream);

        if (id == L"grammar")
        {
            stream.skip_whitespace();

            m_grammar_name.parse(stream);

            wchar_t ch = stream.skip_whitespace();

            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();
        }
        /*else if (id == L"options")
        {
            GrammarOptions options(stream);
        }
		else if (id == L"fragment")
		{
			Identifier frag_id(stream);

			ATNMachine<TCHAR> atn(-1, stream);

			fragments.emplace(frag_id, std::move(atn));
		}*/
        else if (id == L"include")
        {
            wchar_t ch = stream.skip_whitespace();

            if (ch != L'"')
                throw stream.unexpected(ch);
            stream.discard();

            std::wstring wide_path;

            for (ch = stream.get(); ch != L'"'; ch = stream.get())
            {
                wide_path.push_back(ch);
            }

            ch = stream.skip_whitespace();
            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();

            Encoder enc{};

            machine_id = parse(make_include_path(filename, enc.wcstombs(wide_path)), machine_id);
        }
        else
        {
            ATNMachine<TCHAR> atn(machine_id++, stream);

            if (m_root_id.str().empty())
                m_root_id = id;

            m_networks.insert(std::pair<Identifier, ATNMachine<TCHAR> >(id, std::move(atn)));

            m_identifiers.push_back(id);
        }

        //m_networks.emplace(Identifier(stream), ATN<TCHAR>(stream));
    }
    return machine_id;
}